

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BorderSpecs.hpp
# Opt level: O2

void __thiscall sciplot::BorderSpecs::BorderSpecs(BorderSpecs *this)

{
  allocator<char> local_39;
  string local_38;
  
  *(undefined ***)&this->super_LineSpecsOf<sciplot::BorderSpecs> = &PTR__Specs_001afb48;
  LineSpecsOf<sciplot::BorderSpecs>::LineSpecsOf
            (&this->super_LineSpecsOf<sciplot::BorderSpecs>,&PTR_PTR_001ac460);
  DepthSpecsOf<sciplot::BorderSpecs>::DepthSpecsOf
            (&this->super_DepthSpecsOf<sciplot::BorderSpecs>,&PTR_construction_vtable_40__001ac470);
  *(undefined ***)&this->super_LineSpecsOf<sciplot::BorderSpecs> = &PTR__BorderSpecs_001ac400;
  *(undefined ***)&this->super_DepthSpecsOf<sciplot::BorderSpecs> = &PTR__BorderSpecs_001ac440;
  (this->m_encoding).super__Base_bitset<1UL>._M_w = 0;
  (this->m_depth)._M_dataplus._M_p = (pointer)&(this->m_depth).field_2;
  (this->m_depth)._M_string_length = 0;
  (this->m_depth).field_2._M_local_buf[0] = '\0';
  left(this);
  bottom(this);
  LineSpecsOf<sciplot::BorderSpecs>::lineType(&this->super_LineSpecsOf<sciplot::BorderSpecs>,1);
  LineSpecsOf<sciplot::BorderSpecs>::lineWidth(&this->super_LineSpecsOf<sciplot::BorderSpecs>,2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"#404040",&local_39);
  LineSpecsOf<sciplot::BorderSpecs>::lineColor
            (&this->super_LineSpecsOf<sciplot::BorderSpecs>,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DepthSpecsOf<sciplot::BorderSpecs>::front(&this->super_DepthSpecsOf<sciplot::BorderSpecs>);
  return;
}

Assistant:

inline BorderSpecs::BorderSpecs()
{
    left();
    bottom();
    lineType(internal::DEFAULT_BORDER_LINETYPE);
    lineWidth(internal::DEFAULT_BORDER_LINEWIDTH);
    lineColor(internal::DEFAULT_BORDER_LINECOLOR);
    front();
}